

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

int cmdParseScript(char *script,cmdScript_t *s,int diags)

{
  long lVar1;
  FILE *__stream;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  int in_EDX;
  long *in_RSI;
  char *in_RDI;
  cmdTagStep_t tag_step [50];
  char v [65536];
  cmdCtlParse_t ctl;
  cmdInstr_t instr;
  uintptr_t p [10];
  int status;
  int resolved;
  int tags;
  int j;
  int i;
  int b;
  int len;
  int idx;
  uint auStackY_10268 [20];
  cmdCtlParse_t *in_stack_fffffffffffefde8;
  char *in_stack_fffffffffffefdf0;
  uint in_stack_fffffffffffefdfc;
  uintptr_t *in_stack_fffffffffffefe00;
  char *in_stack_fffffffffffefe08;
  undefined1 auStack_100d8 [65552];
  long local_c8;
  ulong local_c0;
  undefined1 local_98 [24];
  size_t local_80;
  long local_78;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_3c = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  sVar2 = strlen(in_RDI);
  local_24 = (int)sVar2;
  local_28 = (int)((ulong)((long)(local_24 + 2) * 0x30) >> 1) + 0x280 + local_24;
  pvVar3 = calloc(1,(long)local_28);
  *local_18 = (long)pvVar3;
  if (*local_18 == 0) {
    local_4 = -1;
  }
  else {
    local_18[1] = *local_18 + 0x28;
    local_18[2] = local_18[1] + 600;
    local_18[4] = local_18[2] + (long)((local_24 + 2) / 2) * 0x30;
    *(int *)(local_18 + 5) = local_24;
    *(undefined4 *)((long)local_18 + 0x2c) = 0;
    *(undefined4 *)(local_18 + 3) = 0;
    local_34 = 0;
    local_20 = 0;
    while (0 < local_24) {
      local_20 = cmdParse(in_stack_fffffffffffefe08,in_stack_fffffffffffefe00,
                          in_stack_fffffffffffefdfc,in_stack_fffffffffffefdf0,
                          in_stack_fffffffffffefde8);
      __stream = _stderr;
      if (((-1 < local_20) || (local_20 != -1)) && (cmdInfo[intCmdIdx].cvis == 0)) {
        local_20 = -4;
      }
      if (local_20 < 0) {
        if (local_1c != 0) {
          if (local_20 == -1) {
            pcVar4 = cmdStr();
            fprintf(__stream,"Unknown command: %s\n",pcVar4);
          }
          else if (local_20 == -4) {
            pcVar4 = cmdStr();
            fprintf(__stream,"Command illegal in script: %s\n",pcVar4);
          }
          else {
            pcVar4 = cmdStr();
            fprintf(__stream,"Bad parameter to %s\n",pcVar4);
          }
        }
        if (local_3c == 0) {
          local_3c = -0x37;
        }
      }
      else {
        if (local_80 != 0) {
          memcpy((void *)(local_18[4] + (long)*(int *)((long)local_18 + 0x2c)),auStack_100d8,
                 local_80);
          *(undefined1 *)(local_18[4] + (long)*(int *)((long)local_18 + 0x2c) + local_80) = 0;
          local_78 = local_18[4] + (long)*(int *)((long)local_18 + 0x2c);
          *(int *)((long)local_18 + 0x2c) = *(int *)((long)local_18 + 0x2c) + (int)local_80 + 1;
        }
        memcpy(&local_c8,local_98,0x28);
        if (local_c8 == 0x331) {
          if (local_34 < 0x32) {
            for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
              if (auStackY_10268[(long)local_30 * 2] == local_c0) {
                if (local_1c != 0) {
                  fprintf(_stderr,"Duplicate tag: %ld\n",local_c0);
                }
                if (local_3c == 0) {
                  local_3c = -0x35;
                }
                local_20 = -1;
              }
            }
            auStackY_10268[(long)local_34 * 2] = (uint)local_c0;
            auStackY_10268[(long)local_34 * 2 + 1] = *(uint *)(local_18 + 3);
            local_34 = local_34 + 1;
          }
          else {
            if (local_1c != 0) {
              fprintf(_stderr,"Too many tags: %ld\n",local_c0);
            }
            if (local_3c == 0) {
              local_3c = -0x36;
            }
            local_20 = -1;
          }
        }
      }
      if ((-1 < local_20) && (local_c8 != 0x331)) {
        lVar1 = local_18[3];
        *(int *)(local_18 + 3) = (int)lVar1 + 1;
        memcpy((void *)(local_18[2] + (long)(int)lVar1 * 0x30),&local_c8,0x30);
      }
    }
    for (local_2c = 0; local_2c < (int)local_18[3]; local_2c = local_2c + 1) {
      memcpy(&local_c8,(void *)(local_18[2] + (long)local_2c * 0x30),0x30);
      if (((local_c8 == 0x32d) || (local_c8 == 0x322)) ||
         ((local_c8 == 0x330 ||
          (((local_c8 == 0x32e || (local_c8 == 0x32c)) || (local_c8 == 0x32f)))))) {
        local_38 = 0;
        for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
          if (local_c0 == auStackY_10268[(long)local_30 * 2]) {
            *(long *)(local_18[2] + (long)local_2c * 0x30 + 8) =
                 (long)(int)auStackY_10268[(long)local_30 * 2 + 1];
            local_38 = 1;
            break;
          }
        }
        if (local_38 == 0) {
          if (local_1c != 0) {
            fprintf(_stderr,"Can\'t resolve tag %ld\n",local_c0);
          }
          if (local_3c == 0) {
            local_3c = -0x3f;
          }
        }
      }
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

int cmdParseScript(char *script, cmdScript_t *s, int diags)
{
   int idx, len, b, i, j, tags, resolved;
   int status;
   uintptr_t p[10];
   cmdInstr_t instr;
   cmdCtlParse_t ctl;
   char v[CMD_MAX_EXTENSION];

   ctl.eaten = 0;

   status = 0;

   cmdTagStep_t tag_step[PI_MAX_SCRIPT_TAGS];

   len = strlen(script);

   /* calloc space for PARAMS, VARS, CMDS, and STRINGS */

   b = (sizeof(int) * (PI_MAX_SCRIPT_PARAMS + PI_MAX_SCRIPT_VARS)) +
       (sizeof(cmdInstr_t) * (len + 2) / 2) + len;

   s->par = calloc(1, b);

   if (s->par == NULL) return -1;

   s->var = s->par + PI_MAX_SCRIPT_PARAMS;

   s->instr = (cmdInstr_t *)(s->var + PI_MAX_SCRIPT_VARS);

   s->str_area = (char *)(s->instr + ((len + 2) / 2));

   s->str_area_len = len;
   s->str_area_pos = 0;

   s->instrs = 0;

   tags = 0;

   idx = 0;

   while (ctl.eaten<len)
   {
      idx = cmdParse(script, p, CMD_MAX_EXTENSION, v, &ctl);

      /* abort if command is illegal in a script */

      if ((idx >= 0) || (idx != CMD_UNKNOWN_CMD))
      {
         if (!cmdInfo[intCmdIdx].cvis) idx = CMD_NOT_IN_SCRIPT;
      }

      if (idx >= 0)
      {
         if (p[3])
         {
            memcpy(s->str_area + s->str_area_pos, v, p[3]);
            s->str_area[s->str_area_pos + p[3]] = 0;
            p[4] = (intptr_t) s->str_area + s->str_area_pos;
            s->str_area_pos += (p[3] + 1);
         }

         memcpy(&instr.p, p, sizeof(instr.p));

         if (instr.p[0] == PI_CMD_TAG)
         {
            if (tags < PI_MAX_SCRIPT_TAGS)
            {
               /* check tag not already used */
               for (j=0; j<tags; j++)
               {
                  if (tag_step[j].tag == instr.p[1])
                  {
                     if (diags)
                     {
                        fprintf(stderr, "Duplicate tag: %"PRIdPTR"\n", instr.p[1]);
                     }

                     if (!status) status = PI_DUP_TAG;
                     idx = -1;
                  }
               }

               tag_step[tags].tag = instr.p[1];
               tag_step[tags].step = s->instrs;
               tags++;
            }
            else
            {
               if (diags)
               {
                  fprintf(stderr, "Too many tags: %"PRIdPTR"\n", instr.p[1]);
               }
               if (!status) status = PI_TOO_MANY_TAGS;
               idx = -1;
            }
         }
      }
      else
      {
         if (diags)
         {
            if (idx == CMD_UNKNOWN_CMD)
               fprintf(stderr, "Unknown command: %s\n", cmdStr());
            else if (idx == CMD_NOT_IN_SCRIPT)
               fprintf(stderr, "Command illegal in script: %s\n", cmdStr());
            else
               fprintf(stderr, "Bad parameter to %s\n", cmdStr());
         }
         if (!status) status = PI_BAD_SCRIPT_CMD;
      }

      if (idx >= 0)
      {
         if (instr.p[0] != PI_CMD_TAG)
         {
            memcpy(instr.opt, &ctl.opt, sizeof(instr.opt));
            s->instr[s->instrs++] = instr;
         }
      }
   }

   for (i=0; i<s->instrs; i++)
   {
      instr = s->instr[i];

      /* resolve jumps */

      if ((instr.p[0] == PI_CMD_JMP) || (instr.p[0] == PI_CMD_CALL) ||
          (instr.p[0] == PI_CMD_JZ)  || (instr.p[0] == PI_CMD_JNZ)  ||
          (instr.p[0] == PI_CMD_JM)  || (instr.p[0] == PI_CMD_JP))
      {
         resolved = 0;

         for (j=0; j<tags; j++)
         {
            if (instr.p[1] == tag_step[j].tag)
            {
               s->instr[i].p[1] = tag_step[j].step;
               resolved = 1;
               break;
            }
         }

         if (!resolved)
         {
            if (diags)
            {
               fprintf(stderr, "Can't resolve tag %"PRIdPTR"\n", instr.p[1]);
            }
            if (!status) status = PI_BAD_TAG;
         }
      }
   }
   return status;
}